

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::DelayControl::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  Type *pTVar2;
  bool bVar3;
  int iVar4;
  ParamAssignmentSyntax *pPVar5;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar6;
  undefined4 extraout_var;
  InvalidTimingControl *pIVar7;
  Diagnostic *diag;
  char *func;
  SourceRange sourceRange;
  InvalidTimingControl *local_28;
  Expression *args;
  
  if (((exprs->parameters).elements.size_ + 1 & 0xfffffffffffffffe) == 2) {
    pPVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                       (&exprs->parameters,0);
    if ((pPVar5->super_SyntaxNode).kind == OrderedParamAssignment) {
      this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                        (&exprs->parameters,0)->super_SyntaxNode;
      pOVar6 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
      pEVar1 = (pOVar6->expr).ptr;
      if (pEVar1 == (ExpressionSyntax *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
        ;
LAB_00286a4e:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,0);
      args = (Expression *)CONCAT44(extraout_var,iVar4);
      pIVar7 = (InvalidTimingControl *)
               BumpAllocator::
               emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange_const&>
                         (&compilation->super_BumpAllocator,args,&args->sourceRange);
      bVar3 = Expression::bad(args);
      local_28 = pIVar7;
      if (!bVar3) {
        pTVar2 = (args->type).ptr;
        if (pTVar2 != (Type *)0x0) {
          bVar3 = Type::isNumeric(pTVar2);
          if (bVar3) {
            return &pIVar7->super_TimingControl;
          }
          diag = ASTContext::addDiag(context,(DiagCode)0x100008,args->sourceRange);
          pTVar2 = (args->type).ptr;
          if (pTVar2 != (Type *)0x0) {
            ast::operator<<(diag,pTVar2);
            goto LAB_00286a08;
          }
        }
        func = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
        goto LAB_00286a4e;
      }
      goto LAB_00286a08;
    }
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
  ASTContext::addDiag(context,(DiagCode)0x4a0007,sourceRange);
  local_28 = (InvalidTimingControl *)0x0;
LAB_00286a08:
  pIVar7 = BumpAllocator::
           emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                     (&compilation->super_BumpAllocator,(TimingControl **)&local_28);
  return &pIVar7->super_TimingControl;
}

Assistant:

TimingControl& DelayControl::fromParams(Compilation& compilation,
                                        const ParameterValueAssignmentSyntax& exprs,
                                        const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() != 1 || items[0]->kind != SyntaxKind::OrderedParamAssignment) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    auto& expr = Expression::bind(*items[0]->as<OrderedParamAssignmentSyntax>().expr, context);
    auto result = compilation.emplace<DelayControl>(expr, expr.sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}